

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t size)

{
  ulong uVar1;
  
  if (this->allocatedElements < size) {
    reallocate(this,size);
  }
  uVar1 = this->usedElements;
  if (uVar1 < size) {
    do {
      this->data[uVar1] = (Expression *)0x0;
      uVar1 = uVar1 + 1;
    } while (size != uVar1);
  }
  this->usedElements = size;
  return;
}

Assistant:

void resize(size_t size) {
    if (size > allocatedElements) {
      reallocate(size);
    }
    // construct new elements
    for (size_t i = usedElements; i < size; i++) {
      new (data + i) T();
    }
    usedElements = size;
  }